

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O0

int supdup_exitcode(Backend *be)

{
  Supdup *supdup;
  Backend *be_local;
  
  if (be[-10].interactor == (Interactor *)0x0) {
    if (((ulong)be[-9].vt & 0x100) == 0) {
      be_local._4_4_ = 0;
    }
    else {
      be_local._4_4_ = 0x7fffffff;
    }
  }
  else {
    be_local._4_4_ = -1;
  }
  return be_local._4_4_;
}

Assistant:

static int supdup_exitcode(Backend *be)
{
    Supdup *supdup = container_of(be, Supdup, backend);
    if (supdup->s != NULL)
        return -1;                     /* still connected */
    else if (supdup->closed_on_socket_error)
        return INT_MAX;     /* a socket error counts as an unclean exit */
    else
        /* Supdup doesn't transmit exit codes back to the client */
        return 0;
}